

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O3

ssize_t __thiscall
gpu::shared_device_buffer::write(shared_device_buffer *this,int __fd,void *__buf,size_t __n)

{
  cl_mem buffer;
  size_t offset;
  Type TVar1;
  ssize_t in_RAX;
  void *ptr;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t extraout_RAX_03;
  ssize_t extraout_RAX_04;
  gpu_exception *this_00;
  long *plVar2;
  Data *pDVar3;
  undefined4 in_register_00000034;
  Context context;
  undefined1 local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (__buf != (void *)0x0) {
    if ((void *)this->size_ < __buf) {
      this_00 = (gpu_exception *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>(&local_90,(unsigned_long)__buf);
      std::operator+(&local_f0,"Too many data for this device buffer: ",&local_90);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110._0_8_ = *plVar2;
      pDVar3 = (Data *)(plVar2 + 2);
      if ((Data *)local_110._0_8_ == pDVar3) {
        local_110._16_8_ = *(undefined8 *)pDVar3;
        local_110._24_8_ = plVar2[3];
        local_110._0_8_ = (Data *)(local_110 + 0x10);
      }
      else {
        local_110._16_8_ = *(undefined8 *)pDVar3;
      }
      local_110._8_8_ = plVar2[1];
      *plVar2 = (long)pDVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      to_string<unsigned_long>(&local_70,this->size_);
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     &local_70);
      gpu_exception::gpu_exception(this_00,&local_50);
      __cxa_throw(this_00,&gpu_exception::typeinfo,std::runtime_error::~runtime_error);
    }
    Context::Context((Context *)local_110);
    TVar1 = Context::type((Context *)local_110);
    if (TVar1 == TypeOpenCL) {
      Context::cl((Context *)&local_f0);
      buffer = (cl_mem)this->data_;
      offset = this->offset_;
      ptr = shared_host_buffer::get((shared_host_buffer *)CONCAT44(in_register_00000034,__fd));
      ocl::OpenCLEngine::writeBuffer
                ((OpenCLEngine *)local_f0._M_dataplus._M_p,buffer,1,offset,(size_t)__buf,ptr);
      in_RAX = extraout_RAX;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_string_length);
        in_RAX = extraout_RAX_00;
      }
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/shared_device_buffer.cpp"
                 ,"");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"No GPU context!","");
      raiseException(&local_b0,0x10c,&local_d0);
      in_RAX = extraout_RAX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
        in_RAX = extraout_RAX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
        in_RAX = extraout_RAX_03;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._16_8_);
      in_RAX = extraout_RAX_04;
    }
  }
  return in_RAX;
}

Assistant:

void shared_device_buffer::write(const shared_host_buffer &buffer, size_t size)
{
	if (!size)
		return;

	if (size > size_)
		throw gpu_exception("Too many data for this device buffer: " + to_string(size) + " > " + to_string(size_));

	Context context;
	switch (context.type()) {
#ifdef CUDA_SUPPORT
	case Context::TypeCUDA:
		CUDA_SAFE_CALL(cudaMemcpy(cuptr(), buffer.get(), size, cudaMemcpyHostToDevice));
		break;
#endif
	case Context::TypeOpenCL:
		context.cl()->writeBuffer((cl_mem) data_, CL_TRUE, offset_, size, buffer.get());
		break;
	default:
		gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}
}